

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_avx2.c
# Opt level: O0

void randomx_argon2_fill_segment_avx2(argon2_instance_t *instance,argon2_position_t position)

{
  uint32_t uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  argon2_instance_t *in_RDI;
  __m256i state [32];
  uint32_t i;
  uint32_t starting_index;
  uint32_t curr_offset;
  uint32_t prev_offset;
  uint64_t ref_lane;
  uint64_t ref_index;
  uint64_t pseudo_rand;
  block input_block;
  block address_block;
  block *curr_block;
  block *ref_block;
  undefined1 auStackY_c80 [1024];
  uint local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  ulong local_870;
  ulong local_868;
  ulong local_860;
  int in_stack_fffffffffffffa5c;
  block *in_stack_fffffffffffffa60;
  block *in_stack_fffffffffffffa68;
  __m256i *in_stack_fffffffffffffa70;
  argon2_position_t local_40 [3];
  
  if (in_RDI != (argon2_instance_t *)0x0) {
    local_87c = 0;
    local_40[0].pass = (uint32_t)in_RSI;
    local_40[0].slice = (uint8_t)in_RDX;
    if ((local_40[0].pass == 0) && (local_40[0].slice == 0)) {
      local_87c = 2;
    }
    local_40[0].lane = SUB84(in_RSI,4);
    local_878 = local_40[0].lane * in_RDI->lane_length +
                (uint)local_40[0].slice * in_RDI->segment_length + local_87c;
    local_874 = local_878;
    if (local_878 % in_RDI->lane_length == 0) {
      local_874 = local_878 + in_RDI->lane_length;
    }
    local_874 = local_874 - 1;
    local_40[0]._0_8_ = in_RSI;
    local_40[0]._8_8_ = in_RDX;
    memcpy(auStackY_c80,in_RDI->memory + local_874,0x400);
    for (local_880 = local_87c; local_880 < in_RDI->segment_length; local_880 = local_880 + 1) {
      if (local_878 % in_RDI->lane_length == 1) {
        local_874 = local_878 - 1;
      }
      local_860 = in_RDI->memory[local_874].v[0];
      local_870 = (local_860 >> 0x20) % (ulong)in_RDI->lanes;
      if ((local_40[0].pass == 0) && (local_40[0].slice == '\0')) {
        local_870 = (ulong)local_40[0].lane;
      }
      local_40[0].index = local_880;
      uVar1 = randomx_argon2_index_alpha
                        (in_RDI,local_40,(uint32_t)local_860,(uint)(local_870 == local_40[0].lane));
      local_868 = (ulong)uVar1;
      if (in_RDI->version == 0x10) {
        fill_block(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   in_stack_fffffffffffffa5c);
      }
      else if (local_40[0].pass == 0) {
        fill_block(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   in_stack_fffffffffffffa5c);
      }
      else {
        fill_block(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   in_stack_fffffffffffffa5c);
      }
      local_878 = local_878 + 1;
      local_874 = local_874 + 1;
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_avx2(const argon2_instance_t* instance,
	argon2_position_t position) {
	block* ref_block = NULL, * curr_block = NULL;
	block address_block, input_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index, i;
	__m256i state[ARGON2_HWORDS_IN_BLOCK];

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	memcpy(state, ((instance->memory + prev_offset)->v), ARGON2_BLOCK_SIZE);

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(state, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(state, ref_block, curr_block, 0);
			}
			else {
				fill_block(state, ref_block, curr_block, 1);
			}
		}
	}
}